

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall mjs::interpreter::impl::scope::put_local(scope *this,string *key,value *val)

{
  bool bVar1;
  uint uVar2;
  long *plVar3;
  uint *puVar4;
  scope *this_00;
  gc_heap_ptr<mjs::object> act;
  undefined1 local_40 [32];
  
  gc_heap::unsafe_create_from_position<mjs::object>((gc_heap *)local_40,(uint32_t)this->heap_);
  bVar1 = gc_heap_ptr_untyped::has_type<mjs::activation_object>((gc_heap_ptr_untyped *)local_40);
  if (!bVar1) {
    bVar1 = is_global_object((object_ptr *)local_40);
    if (!bVar1) {
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
      puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)key);
      local_40._24_8_ = puVar4 + 1;
      local_40._16_8_ = ZEXT48(*puVar4);
      uVar2 = (**(code **)(*plVar3 + 0x30))(plVar3);
      if (0x10 < uVar2) {
        __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                      ,0x24,"bool mjs::is_valid(property_attribute)");
      }
      if (uVar2 == 0x10) {
        if ((this->prev_).pos_ == 0) {
          __assert_fail("prev_",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                        ,0x48f,
                        "void mjs::interpreter::impl::scope::put_local(const string &, const value &)"
                       );
        }
        this_00 = gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::dereference
                            (&this->prev_,this->heap_);
        put_local(this_00,key,val);
        goto LAB_0011e142;
      }
    }
  }
  plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
  (**(code **)(*plVar3 + 0x28))(plVar3,key,val,4);
LAB_0011e142:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_40);
  return;
}

Assistant:

void put_local(const string& key, const value& val) {
            auto act = activation_.track(heap_);
            // Hack-ish, but variable/function definitions end up in e.g. in the "with" object otherwise
            // The final check if is in the case of a variabl declaration 'shadowing' the catch identifier
            if (act.has_type<activation_object>() || is_global_object(act) || is_valid(act->own_property_attributes(key.view()))) {
                act->redefine_own_property(key, val, property_attribute::dont_delete);
            } else {
                assert(prev_);
                prev_.dereference(heap_).put_local(key, val);
            }
        }